

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosString.cpp
# Opt level: O1

void adios2::helper::SetParameterValueInt(string *key,Params *parameters,int *value,string *hint)

{
  _Rb_tree_header *p_Var1;
  int32_t iVar2;
  const_iterator cVar3;
  string *input;
  string keyLC;
  string local_50;
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&parameters->_M_t,key);
  p_Var1 = &(parameters->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar3._M_node == p_Var1) {
    LowerCase<std::__cxx11::string>(&local_50,(helper *)key,input);
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&parameters->_M_t,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((_Rb_tree_header *)cVar3._M_node == p_Var1) {
      return;
    }
  }
  iVar2 = StringTo<int>((string *)(cVar3._M_node + 2),hint);
  *value = iVar2;
  return;
}

Assistant:

void SetParameterValueInt(const std::string key, const Params &parameters, int &value,
                          const std::string &hint)
{
    auto itKey = parameters.find(key);
    if (itKey == parameters.end())
    {
        // try lower case
        const std::string keyLC = LowerCase(key);

        itKey = parameters.find(keyLC);
        if (itKey == parameters.end())
        {
            return;
        }
    }

    value = static_cast<int>(StringTo<int32_t>(itKey->second, hint));
}